

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O0

void retro_get_system_info(retro_system_info *info)

{
  retro_system_info *info_local;
  
  memset(info,0,0x20);
  info->library_name = "gb";
  info->library_version = "0.93";
  info->need_fullpath = true;
  info->block_extract = false;
  info->valid_extensions = "gb";
  return;
}

Assistant:

void retro_get_system_info(struct retro_system_info *info)
{
   memset(info, 0, sizeof(struct retro_system_info));
   info->library_name     = "gb";
   info->library_version  = "0.93";
   info->need_fullpath    = true;
   info->block_extract    = false;
   info->valid_extensions = "gb";
}